

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_dconst_0(ExecutionEngine *this)

{
  Value operand;
  Value operand_00;
  VMStack *this_00;
  Frame *this_01;
  undefined4 local_40;
  Value value;
  Value padding;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand_00.type = 10;
  operand_00.printType = value.data.intValue;
  operand_00.data = (anon_union_8_10_52016fac_for_data)padding._0_8_;
  Frame::pushIntoOperandStack(this_01,operand_00);
  operand.type = 7;
  operand.printType = local_40;
  operand.data.longValue = 0;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_dconst_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value padding;
    padding.type = ValueType::PADDING;

    Value value;
    value.type = ValueType::DOUBLE;
    value.data.doubleValue = 0;

    topFrame->pushIntoOperandStack(padding);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}